

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O3

Error * ot::commissioner::PathExists(Error *__return_storage_ptr__,string *path)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string local_78;
  pointer local_58;
  char *pcStack_50;
  size_t local_48;
  undefined8 local_40;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  code *local_30;
  
  iVar1 = access((path->_M_dataplus)._M_p,0);
  if (iVar1 == 0) {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    puVar2 = (uint *)__errno_location();
    if (*puVar2 == 0x14) {
      local_58 = (pointer)CONCAT44(local_58._4_4_,string_type);
      pcStack_50 = "{} path is not a directory";
      local_48 = 0x1a;
      local_40._0_4_ = 0;
      local_40._4_4_ = 1;
      local_30 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar4 = "{} path is not a directory";
      local_38 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58;
      do {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) goto LAB_001226dd;
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar4,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_58);
        }
        pcVar4 = pcVar3;
      } while (pcVar3 != "");
      local_58 = (path->_M_dataplus)._M_p;
      pcStack_50 = (char *)path->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1a;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"{} path is not a directory",fmt_00,args_00);
      __return_storage_ptr__->mCode = kNotFound;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->mMessage,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
    }
    else if (*puVar2 == 2) {
      local_58 = (pointer)CONCAT44(local_58._4_4_,string_type);
      pcStack_50 = "{} path does not exist";
      local_48 = 0x16;
      local_40._0_4_ = 0;
      local_40._4_4_ = 1;
      local_30 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar4 = "{} path does not exist";
      local_38 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58;
      do {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
LAB_001226dd:
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar4,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_58);
        }
        pcVar4 = pcVar3;
      } while (pcVar3 != "");
      local_58 = (path->_M_dataplus)._M_p;
      pcStack_50 = (char *)path->_M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x16;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"{} path does not exist",fmt,args);
      __return_storage_ptr__->mCode = kNotFound;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->mMessage,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
    }
    else {
      local_58 = (pointer)CONCAT44(local_58._4_4_,int_type);
      pcStack_50 = "path error, errno = {}";
      local_48 = 0x16;
      local_40._0_4_ = 0;
      local_40._4_4_ = 1;
      local_30 = ::fmt::v10::detail::
                 parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
      pcVar4 = "path error, errno = {}";
      local_38 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58;
      do {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) goto LAB_001226dd;
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                             (pcVar4,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_58);
        }
        pcVar4 = pcVar3;
      } while (pcVar3 != "");
      local_58 = (pointer)(ulong)*puVar2;
      fmt_01.size_ = 1;
      fmt_01.data_ = (char *)0x16;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"path error, errno = {}",fmt_01,args_01);
      __return_storage_ptr__->mCode = kNotFound;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->mMessage,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error PathExists(std::string path)
{
    int err = access(path.c_str(), F_OK);
    if (err != 0)
    {
        switch (errno)
        {
        case ENOENT:
            return ERROR_NOT_FOUND("{} path does not exist", path);
        case ENOTDIR:
            return ERROR_NOT_FOUND("{} path is not a directory", path);
        default:
            return ERROR_NOT_FOUND("path error, errno = {}", errno);
        }
    }
    return ERROR_NONE;
}